

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs.c
# Opt level: O1

void uv__fs_done(uv__work *w,int status)

{
  undefined8 in_RAX;
  undefined8 in_RDX;
  undefined4 in_register_00000034;
  
  if (w[-7].done + 0x20 == *(code **)(w[-7].done + 0x20)) {
    __assert_fail("uv__has_active_reqs(req->loop)","src/unix/fs.c",0x29e,
                  "void uv__fs_done(struct uv__work *, int)");
  }
  *(void **)w[-8].wq[1] = w[-8].wq[0];
  *(void **)((long)w[-8].wq[0] + 8) = w[-8].wq[1];
  if (status == -0x7d) {
    if (w[-7].wq[0] != (void *)0x0) {
      __assert_fail("req->result == 0","src/unix/fs.c",0x2a1,
                    "void uv__fs_done(struct uv__work *, int)");
    }
    w[-7].wq[0] = (void *)0xffffffffffffff83;
  }
  if (w[-7].loop != (uv_loop_s *)0x0) {
    (*(code *)w[-7].loop)(&w[-8].done,CONCAT44(in_register_00000034,status),in_RDX,in_RAX);
    return;
  }
  return;
}

Assistant:

static void uv__fs_done(struct uv__work* w, int status) {
  uv_fs_t* req;

  req = container_of(w, uv_fs_t, work_req);
  uv__req_unregister(req->loop, req);

  if (status == -ECANCELED) {
    assert(req->result == 0);
    req->result = -ECANCELED;
  }

  if (req->cb != NULL)
    req->cb(req);
}